

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall singleParticleSpectra::outputRapidityPTDistribution(singleParticleSpectra *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  _Setprecision _Var5;
  ostream *poVar6;
  char *pcVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  string *in_RDI;
  double Qn_imag;
  double Qn_real;
  int iorder;
  double dET;
  double dN;
  double pT_bin_mid;
  int j;
  double rap_bin_mid;
  int i;
  ofstream output;
  ostringstream filename;
  string rapName;
  int local_410;
  double local_3f8;
  int local_3ec;
  value_type local_3e8;
  int local_3dc;
  string local_3d8 [32];
  ostream local_3b8 [512];
  ostringstream local_1b8 [399];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"eta",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  if (*(int *)(in_RDI + 0x238) == 1) {
    std::__cxx11::string::operator=(local_28,"y");
  }
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar6 = std::operator<<((ostream *)local_1b8,in_RDI);
  poVar6 = std::operator<<(poVar6,"/particle_");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)(in_RDI + 0x1b8));
  poVar6 = std::operator<<(poVar6,"_pT");
  poVar6 = std::operator<<(poVar6,local_28);
  std::operator<<(poVar6,"_distribution");
  if (((byte)in_RDI[0x1bc] & 1) != 0) {
    std::operator<<((ostream *)local_1b8,"_weakFD");
  }
  std::operator<<((ostream *)local_1b8,".dat");
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_3b8,pcVar7,_S_out);
  std::__cxx11::string::~string(local_3d8);
  poVar6 = std::operator<<(local_3b8,"# y  pT  N  E_T");
  poVar6 = std::operator<<(poVar6,"  Qn_real  Qn_imag (n = 1 -");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)(in_RDI + 0x1c8) + -1);
  poVar6 = std::operator<<(poVar6,")");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(local_3b8,"# Nev = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)(in_RDI + 0x2f8));
  poVar6 = std::operator<<(poVar6," d");
  poVar6 = std::operator<<(poVar6,local_28);
  poVar6 = std::operator<<(poVar6," = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(double *)(in_RDI + 0x268));
  poVar6 = std::operator<<(poVar6," dpT = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(double *)(in_RDI + 0x1e8));
  poVar6 = std::operator<<(poVar6," GeV");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (local_3dc = 0; local_3dc < *(int *)(in_RDI + 0x254); local_3dc = local_3dc + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x270),(long)local_3dc)
    ;
    local_3e8 = *pvVar8;
    for (local_3ec = 0; local_3ec < *(int *)(in_RDI + 0x1d0); local_3ec = local_3ec + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1f0),
                          (long)local_3ec);
      local_3f8 = *pvVar8;
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI + 0x3c8),(long)local_3dc);
      pvVar10 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](pvVar9,(long)local_3ec);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,2);
      if (0.0 < *pvVar8) {
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0x3c8),(long)local_3dc);
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](pvVar9,(long)local_3ec);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,0);
        dVar1 = *pvVar8;
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0x3c8),(long)local_3dc);
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](pvVar9,(long)local_3ec);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,2);
        local_3e8 = dVar1 / *pvVar8;
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0x3c8),(long)local_3dc);
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](pvVar9,(long)local_3ec);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,1);
        dVar1 = *pvVar8;
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0x3c8),(long)local_3dc);
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](pvVar9,(long)local_3ec);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,2);
        local_3f8 = dVar1 / *pvVar8;
      }
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI + 0x3c8),(long)local_3dc);
      pvVar10 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](pvVar9,(long)local_3ec);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,2);
      dVar1 = *pvVar8;
      iVar3 = *(int *)(in_RDI + 0x2f8);
      pvVar9 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI + 0x3c8),(long)local_3dc);
      pvVar10 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](pvVar9,(long)local_3ec);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,3);
      dVar2 = *pvVar8;
      iVar4 = *(int *)(in_RDI + 0x2f8);
      poVar6 = (ostream *)std::ostream::operator<<(local_3b8,std::scientific);
      _Var5 = std::setprecision(8);
      poVar6 = std::operator<<(poVar6,_Var5);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3e8);
      poVar6 = std::operator<<(poVar6,"  ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3f8);
      poVar6 = std::operator<<(poVar6,"  ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar1 / (double)iVar3);
      poVar6 = std::operator<<(poVar6,"  ");
      std::ostream::operator<<(poVar6,dVar2 / (double)iVar4);
      for (local_410 = 1; local_410 < *(int *)(in_RDI + 0x1c8); local_410 = local_410 + 1) {
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0x3c8),(long)local_3dc);
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](pvVar9,(long)local_3ec);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar10,(long)(local_410 * 2 + 2));
        dVar1 = *pvVar8;
        iVar3 = *(int *)(in_RDI + 0x2f8);
        pvVar9 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0x3c8),(long)local_3dc);
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](pvVar9,(long)local_3ec);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar10,(long)(local_410 * 2 + 3));
        dVar2 = *pvVar8;
        iVar4 = *(int *)(in_RDI + 0x2f8);
        poVar6 = std::operator<<(local_3b8,"  ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar1 / (double)iVar3);
        poVar6 = std::operator<<(poVar6,"  ");
        std::ostream::operator<<(poVar6,dVar2 / (double)iVar4);
      }
      std::ostream::operator<<(local_3b8,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_3b8);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void singleParticleSpectra::outputRapidityPTDistribution() {
    std::string rapName = "eta";
    if (rap_type == 1) {
        rapName = "y";
    }
    ostringstream filename;
    filename << path_ << "/particle_" << particle_monval << "_pT" << rapName
             << "_distribution";
    if (bWeakFeedDown_) filename << "_weakFD";
    filename << ".dat";
    ofstream output(filename.str().c_str());
    output << "# y  pT  N  E_T"
           << "  Qn_real  Qn_imag (n = 1 -" << order_max - 1 << ")" << endl;
    output << "# Nev = " << total_number_of_events << " d" << rapName << " = "
           << drap << " dpT = " << dpT << " GeV" << endl;

    for (int i = 0; i < N_rap; i++) {
        double rap_bin_mid = rapidity_array[i];
        for (int j = 0; j < npT; j++) {
            double pT_bin_mid = pT_array[j];
            if (Qn_pTrapdiff_vector[i][j][2] > 0) {
                rap_bin_mid =
                    (Qn_pTrapdiff_vector[i][j][0]
                     / Qn_pTrapdiff_vector[i][j][2]);
                pT_bin_mid =
                    (Qn_pTrapdiff_vector[i][j][1]
                     / Qn_pTrapdiff_vector[i][j][2]);
            }
            double dN = Qn_pTrapdiff_vector[i][j][2] / total_number_of_events;
            double dET = Qn_pTrapdiff_vector[i][j][3] / total_number_of_events;
            output << scientific << setprecision(8) << rap_bin_mid << "  "
                   << pT_bin_mid << "  " << dN << "  " << dET;
            // vn
            for (int iorder = 1; iorder < order_max; iorder++) {
                double Qn_real =
                    (Qn_pTrapdiff_vector[i][j][2 * iorder + 2]
                     / total_number_of_events);
                double Qn_imag =
                    (Qn_pTrapdiff_vector[i][j][2 * iorder + 3]
                     / total_number_of_events);
                output << "  " << Qn_real << "  " << Qn_imag;
            }
            output << endl;
        }
    }
    output.close();
}